

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O3

string * __thiscall
duckdb::IntegralCompressFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,LogicalType *result_type)

{
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  LogicalTypeId type;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  char local_28 [16];
  
  local_78[0] = local_68;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"__internal_compress_integral_%s","");
  LogicalTypeIdToString_abi_cxx11_((string *)local_58,(duckdb *)(ulong)(byte)*this,type);
  StringUtil::Lower((string *)&local_38,(string *)local_58);
  StringUtil::Format<std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_78,(string *)&local_38,in_RCX);
  if ((char *)local_38._M_allocated_capacity != local_28) {
    operator_delete((void *)local_38._M_allocated_capacity);
  }
  psVar1 = (string *)(local_58 + 0x10);
  if ((string *)local_58._0_8_ != psVar1) {
    operator_delete((void *)local_58._0_8_);
    psVar1 = extraout_RAX;
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
    psVar1 = extraout_RAX_00;
  }
  return psVar1;
}

Assistant:

static string IntegralCompressFunctionName(const LogicalType &result_type) {
	return StringUtil::Format("__internal_compress_integral_%s",
	                          StringUtil::Lower(LogicalTypeIdToString(result_type.id())));
}